

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall BinaryExpression::restoreXml(BinaryExpression *this,Element *el,Translate *trans)

{
  int4 *piVar1;
  pointer ppEVar2;
  PatternExpression *pPVar3;
  
  ppEVar2 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar3 = PatternExpression::restoreExpression(*ppEVar2,trans);
  this->left = pPVar3;
  pPVar3 = PatternExpression::restoreExpression(ppEVar2[1],trans);
  this->right = pPVar3;
  piVar1 = &this->left->refcount;
  *piVar1 = *piVar1 + 1;
  pPVar3->refcount = pPVar3->refcount + 1;
  return;
}

Assistant:

void BinaryExpression::restoreXml(const Element *el,Translate *trans)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  left = PatternExpression::restoreExpression(*iter,trans);
  ++iter;
  right = PatternExpression::restoreExpression(*iter,trans);
  left->layClaim();
  right->layClaim();
}